

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Human.cpp
# Opt level: O1

string * __thiscall Human::Age_Getter_abi_cxx11_(string *__return_storage_ptr__,Human *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Age)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Age)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string Human ::Age_Getter(){
    return Age;
}